

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O2

string * fs_get_cwd_abi_cxx11_(void)

{
  string *in_RDI;
  string_view in;
  string_view fname;
  string local_68;
  path s;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::current_path_abi_cxx11_((error_code *)&s);
  if (ec._M_value == 0) {
    std::filesystem::__cxx11::path::generic_string(&local_68,&s);
    in._M_str = local_68._M_dataplus._M_p;
    in._M_len = local_68._M_string_length;
    fs_drop_slash_abi_cxx11_(in_RDI,in);
    std::__cxx11::string::~string((string *)&local_68);
    std::filesystem::__cxx11::path::~path(&s);
  }
  else {
    std::filesystem::__cxx11::path::~path(&s);
    fname._M_str = "fs_get_cwd";
    fname._M_len = 10;
    fs_print_error((string_view)(ZEXT816(0x1186dc) << 0x40),fname,&ec);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  return in_RDI;
}

Assistant:

std::string fs_get_cwd()
{
  // does not have trailing slash
  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  if(auto s = std::filesystem::current_path(ec); !ec) FFS_LIKELY
    return fs_drop_slash(s.generic_string());
#elif defined(_WIN32)
// windows.h https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-getcurrentdirectory
  if(DWORD L = GetCurrentDirectoryA(0, nullptr); L > 0)  FFS_LIKELY
  {
    std::string r(L, '\0');
    if(GetCurrentDirectoryA(L, r.data()) == L-1)  FFS_LIKELY
    {
      r.resize(L-1);
      return fs_as_posix(r);
    }
  }
#else
// unistd.h https://www.man7.org/linux/man-pages/man3/getcwd.3.html
  if(std::string buf(fs_get_max_path(), '\0');
      getcwd(buf.data(), buf.size()))  FFS_LIKELY
    return fs_drop_slash(fs_trim(buf));
#endif

  fs_print_error("", __func__, ec);
  return {};
}